

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

int __thiscall libtorrent::settings_pack::get_int(settings_pack *this,int name)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer ppVar4;
  value_type *pvVar5;
  bool bVar6;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_50;
  pair<unsigned_short,_int> *local_48;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_40;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  local_38;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  i;
  unsigned_short local_26;
  pair<unsigned_short,_int> local_24;
  pair<unsigned_short,_int> v;
  int name_local;
  settings_pack *this_local;
  
  if ((name & 0xc000U) == 0x4000) {
    v._0_4_ = name;
    unique0x100001a2 = this;
    sVar2 = ::std::
            vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
            ::size(&this->m_ints);
    if (sVar2 == 0x9f) {
      pvVar3 = ::std::
               vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
               ::operator[](&this->m_ints,(long)(int)(v._0_4_ & 0x3fff));
      this_local._4_4_ = pvVar3->second;
    }
    else {
      local_26 = libtorrent::aux::numeric_cast<unsigned_short,int,void>(v._0_4_);
      i._M_current._4_4_ = 0;
      ::std::pair<unsigned_short,_int>::pair<unsigned_short,_int,_true>
                (&local_24,&local_26,(int *)((long)&i._M_current + 4));
      local_40._M_current =
           (pair<unsigned_short,_int> *)
           ::std::
           vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ::begin(&this->m_ints);
      local_48 = (pair<unsigned_short,_int> *)
                 ::std::
                 vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                 ::end(&this->m_ints);
      local_38 = ::std::
                 lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>
                           (local_40,(__normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                                      )local_48,&local_24,
                            anon_unknown.dwarf_c13c2b::compare_first<int>);
      local_50._M_current =
           (pair<unsigned_short,_int> *)
           ::std::
           vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ::end(&this->m_ints);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_50);
      bVar6 = false;
      if (bVar1) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                 ::operator->(&local_38);
        bVar6 = (uint)ppVar4->first == v._0_4_;
      }
      if (bVar6) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                 ::operator->(&local_38);
        this_local._4_4_ = ppVar4->second;
      }
      else {
        pvVar5 = libtorrent::aux::
                 container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                 ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                               *)(anonymous_namespace)::int_settings,(long)(int)(v._0_4_ & 0x3fff));
        this_local._4_4_ = pvVar5->default_value;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int settings_pack::get_int(int name) const
	{
		TORRENT_ASSERT_PRECOND((name & type_mask) == int_type_base);
		if ((name & type_mask) != int_type_base) return 0;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_ints.size() == settings_pack::num_int_settings)
		{
			TORRENT_ASSERT(m_ints[name & index_mask].first == name);
			return m_ints[name & index_mask].second;
		}
		std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
		auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
				, &compare_first<int>);
		if (i != m_ints.end() && i->first == name) return i->second;

		return int_settings[name & index_mask].default_value;
	}